

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,uint value)

{
  bool bVar1;
  long lVar2;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar3;
  uint uVar4;
  char *pcVar5;
  char *__last;
  byte bVar6;
  char local_15 [13];
  
  uVar4 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  __last = local_15 +
           ((uVar4 - (value < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                       (ulong)uVar4 * 4))) + 1);
  pcVar5 = __last;
  uVar4 = value;
  if (99 < value) {
    do {
      value = uVar4 / 100;
      *(undefined2 *)(pcVar5 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar4 % 100) * 2);
      pcVar5 = pcVar5 + -2;
      bVar1 = 9999 < uVar4;
      uVar4 = uVar4 / 100;
    } while (bVar1);
  }
  bVar3.container = (this->out_).container;
  if (value < 10) {
    bVar6 = (byte)value | 0x30;
    lVar2 = -1;
  }
  else {
    pcVar5[-1] = internal::basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar6 = internal::basic_data<void>::DIGITS[(ulong)value * 2];
    lVar2 = -2;
  }
  pcVar5[lVar2] = bVar6;
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (local_15,__last,bVar3);
  (this->out_).container = bVar3.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }